

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calculateRootLogLikelihoodsByPartition
          (BeagleCPUImpl<double,_1,_0> *this,int *bufferIndices,int *categoryWeightsIndices,
          int *stateFrequenciesIndices,int *cumulativeScaleIndices,int *partitionIndices,
          int partitionCount,int count,double *outSumLogLikelihoodByPartition,
          double *outSumLogLikelihood)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  int in_stack_00000008;
  int in_stack_00000010;
  long in_stack_00000018;
  int i;
  int returnCode;
  int local_38;
  int local_34;
  
  local_34 = 0;
  if (in_stack_00000010 == 1) {
    if ((in_RDI[0xb] & 0x80U) == 0) {
      if ((in_RDI[0xb] & 0x100U) == 0) {
        if ((*(byte *)((long)in_RDI + 0x13c) & 1) == 0) {
          (**(code **)(*in_RDI + 0x250))(in_RDI,in_RSI,in_RDX,in_RCX,in_R8,in_R9);
        }
        else {
          (**(code **)(*in_RDI + 0x240))(in_RDI,in_RSI,in_RDX,in_RCX,in_R8,in_R9);
        }
        *_i = 0.0;
        for (local_38 = 0; local_38 < in_stack_00000008; local_38 = local_38 + 1) {
          *_i = *(double *)(in_stack_00000018 + (long)local_38 * 8) + *_i;
        }
        if ((*_i != *_i) || (NAN(*_i) || NAN(*_i))) {
          local_34 = -8;
        }
      }
      else {
        local_34 = -7;
      }
    }
    else {
      local_34 = -7;
    }
  }
  else {
    local_34 = -7;
  }
  return local_34;
}

Assistant:

BEAGLE_CPU_TEMPLATE
    int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calculateRootLogLikelihoodsByPartition(
                                                                  const int* bufferIndices,
                                                                  const int* categoryWeightsIndices,
                                                                  const int* stateFrequenciesIndices,
                                                                  const int* cumulativeScaleIndices,
                                                                  const int* partitionIndices,
                                                                  int partitionCount,
                                                                  int count,
                                                                  double* outSumLogLikelihoodByPartition,
                                                                  double* outSumLogLikelihood) {

    int returnCode = BEAGLE_SUCCESS;

    if (count == 1) {
        if (kFlags & BEAGLE_FLAG_SCALING_AUTO) {
            returnCode = BEAGLE_ERROR_NO_IMPLEMENTATION;
        } else if (kFlags & BEAGLE_FLAG_SCALING_ALWAYS) {
            returnCode = BEAGLE_ERROR_NO_IMPLEMENTATION;
        } else {
            if (kThreadingEnabled) {
                calcRootLogLikelihoodsByPartitionAsync(bufferIndices, categoryWeightsIndices, stateFrequenciesIndices, cumulativeScaleIndices, partitionIndices, partitionCount, outSumLogLikelihoodByPartition);
            } else {
                calcRootLogLikelihoodsByPartition(bufferIndices, categoryWeightsIndices, stateFrequenciesIndices, cumulativeScaleIndices, partitionIndices, partitionCount, outSumLogLikelihoodByPartition);
            }

            *outSumLogLikelihood = 0.0;

            for (int i = 0; i < partitionCount; i++) {
                *outSumLogLikelihood += outSumLogLikelihoodByPartition[i];
            }

            if (*outSumLogLikelihood != *outSumLogLikelihood)
                returnCode = BEAGLE_ERROR_FLOATING_POINT;
        }
    } else {
        returnCode = BEAGLE_ERROR_NO_IMPLEMENTATION;
    }

    return returnCode;
}